

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void get_sesslist(sesslist *list,_Bool allocate)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  strbuf *out;
  settings_e *handle;
  char *pcVar5;
  char **ppcVar6;
  long lVar7;
  undefined7 in_register_00000031;
  size_t __nmemb;
  
  if ((int)CONCAT71(in_register_00000031,allocate) != 0) {
    out = strbuf_new();
    if (sesslist_demo_mode == true) {
      BinarySink_put_asciz(out->binarysink_,"demo-server");
      BinarySink_put_asciz(out->binarysink_,"demo-server-2");
    }
    else {
      handle = enum_settings_start();
      if (handle != (settings_e *)0x0) {
        _Var2 = enum_settings_next(handle,out);
        if (_Var2) {
          do {
            BinarySink_put_byte(out->binarysink_,'\0');
            _Var2 = enum_settings_next(handle,out);
          } while (_Var2);
        }
        enum_settings_finish(handle);
      }
      BinarySink_put_byte(out->binarysink_,'\0');
    }
    pcVar5 = strbuf_to_str(out);
    list->buffer = pcVar5;
    list->nsessions = 1;
    cVar1 = *pcVar5;
    while (cVar1 != '\0') {
      iVar3 = strcmp(pcVar5,"Default Settings");
      if (iVar3 != 0) {
        list->nsessions = list->nsessions + 1;
      }
      do {
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != '\0');
      cVar1 = *pcVar5;
    }
    ppcVar6 = (char **)safemalloc((long)list->nsessions + 1,8,0);
    list->sessions = ppcVar6;
    *ppcVar6 = "Default Settings";
    pcVar5 = list->buffer;
    if (*pcVar5 == '\0') {
      __nmemb = 1;
    }
    else {
      iVar3 = 1;
      do {
        iVar4 = strcmp(pcVar5,"Default Settings");
        if (iVar4 != 0) {
          lVar7 = (long)iVar3;
          iVar3 = iVar3 + 1;
          list->sessions[lVar7] = pcVar5;
        }
        do {
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar1 != '\0');
      } while (*pcVar5 != '\0');
      __nmemb = (size_t)iVar3;
    }
    qsort(list->sessions,__nmemb,8,sessioncmp);
    return;
  }
  safefree(list->buffer);
  safefree(list->sessions);
  list->sessions = (char **)0x0;
  list->buffer = (char *)0x0;
  return;
}

Assistant:

void get_sesslist(struct sesslist *list, bool allocate)
{
    int i;
    char *p;
    settings_e *handle;

    if (allocate) {
        strbuf *sb = strbuf_new();

        if (sesslist_demo_mode) {
            put_asciz(sb, "demo-server");
            put_asciz(sb, "demo-server-2");
        } else {
            if ((handle = enum_settings_start()) != NULL) {
                while (enum_settings_next(handle, sb))
                    put_byte(sb, '\0');
                enum_settings_finish(handle);
            }
            put_byte(sb, '\0');
        }

        list->buffer = strbuf_to_str(sb);

        /*
         * Now set up the list of sessions. Note that "Default
         * Settings" must always be claimed to exist, even if it
         * doesn't really.
         */

        p = list->buffer;
        list->nsessions = 1;           /* "Default Settings" counts as one */
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->nsessions++;
            while (*p)
                p++;
            p++;
        }

        list->sessions = snewn(list->nsessions + 1, const char *);
        list->sessions[0] = "Default Settings";
        p = list->buffer;
        i = 1;
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->sessions[i++] = p;
            while (*p)
                p++;
            p++;
        }

        qsort(list->sessions, i, sizeof(const char *), sessioncmp);
    } else {
        sfree(list->buffer);
        sfree(list->sessions);
        list->buffer = NULL;
        list->sessions = NULL;
    }
}